

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  uint64_t *puVar8;
  uint uVar9;
  uint uVar10;
  uint offset;
  ulong uVar11;
  bool bVar12;
  secp256k1_scalar s;
  
  puVar8 = (uint64_t *)CONCAT44(in_register_00000034,len);
  for (lVar4 = 0; lVar4 != 0x81; lVar4 = lVar4 + 1) {
    wnaf[lVar4] = 0;
  }
  s.d[2] = puVar8[2];
  s.d[3] = puVar8[3];
  s.d[0] = *puVar8;
  s.d[1] = puVar8[1];
  uVar7 = 0xffffffffffffffff;
  if ((long)puVar8[3] < 0) {
    secp256k1_scalar_negate(&s,&s);
    iVar5 = -1;
  }
  else {
    iVar5 = 1;
  }
  uVar9 = (uint)a;
  iVar3 = 0;
  uVar10 = 0;
  do {
    uVar11 = (ulong)iVar3;
    uVar6 = 0x81 - iVar3;
    while( true ) {
      offset = (uint)uVar11;
      if (0x80 < (int)offset) {
        return (int)uVar7 + 1;
      }
      if (((s.d[uVar11 >> 6 & 0x3ffffff] >> (uVar11 & 0x3f) & 1) != 0) != uVar10) break;
      uVar11 = uVar11 + 1;
      uVar6 = uVar6 - 1;
    }
    uVar2 = 0x81 - offset;
    if ((int)uVar9 <= (int)(0x81 - offset)) {
      uVar2 = uVar9;
    }
    uVar1 = secp256k1_scalar_get_bits_var(&s,offset,uVar2);
    uVar2 = uVar1 + uVar10;
    bVar12 = (uVar2 >> (uVar9 - 1 & 0x1f) & 1) != 0;
    uVar10 = (uint)bVar12;
    wnaf[uVar11] = (uVar2 - ((uint)bVar12 << ((byte)a & 0x1f))) * iVar5;
    if ((int)uVar9 < (int)uVar6) {
      uVar6 = uVar9;
    }
    iVar3 = uVar6 + offset;
    uVar7 = uVar11 & 0xffffffff;
  } while( true );
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    for (bit = 0; bit < len; bit++) {
        wnaf[bit] = 0;
    }

    s = *a;
    if (secp256k1_scalar_get_bits_limb32(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    bit = 0;
    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits_limb32(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}